

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pic.c
# Opt level: O0

void sysbvm_pic_flushSelector(sysbvm_pic_t *pic,sysbvm_tuple_t selector)

{
  uint sequence_00;
  sysbvm_picEntry_t *entry;
  int i;
  uint32_t sequence;
  sysbvm_tuple_t selector_local;
  sysbvm_pic_t *pic_local;
  
  sequence_00 = sysbvm_pic_writeLock(pic);
  for (entry._0_4_ = 0; (int)entry < 4; entry._0_4_ = (int)entry + 1) {
    if (pic->entries[(int)entry].selector == selector) {
      memset(pic->entries + (int)entry,0,0x18);
    }
  }
  sysbvm_pic_writeUnlock(pic,sequence_00);
  return;
}

Assistant:

SYSBVM_API void sysbvm_pic_flushSelector(sysbvm_pic_t *pic, sysbvm_tuple_t selector)
{
    uint32_t sequence = sysbvm_pic_writeLock(pic);
    for(int i = 0; i < SYSBVM_PIC_ENTRY_COUNT; ++i)
    {
        sysbvm_picEntry_t *entry = pic->entries + i;
        if(entry->selector == selector)
            memset(entry, 0, sizeof(sysbvm_picEntry_t));
    }
    sysbvm_pic_writeUnlock(pic, sequence);
}